

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmx-impl.inc.c
# Opt level: O0

void gen_vmrglw(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  uint32_t uVar1;
  TCGv_ptr arg2;
  TCGv_ptr arg3;
  TCGv_ptr arg1;
  TCGv_ptr rd;
  TCGv_ptr rb;
  TCGv_ptr ra;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if (((ctx->altivec_enabled ^ 0xffU) & 1) == 0) {
    uVar1 = rA(ctx->opcode);
    arg2 = gen_avr_ptr(tcg_ctx_00,uVar1);
    uVar1 = rB(ctx->opcode);
    arg3 = gen_avr_ptr(tcg_ctx_00,uVar1);
    uVar1 = rD(ctx->opcode);
    arg1 = gen_avr_ptr(tcg_ctx_00,uVar1);
    gen_helper_vmrglw(tcg_ctx_00,arg1,arg2,arg3);
    tcg_temp_free_ptr(tcg_ctx_00,arg2);
    tcg_temp_free_ptr(tcg_ctx_00,arg3);
    tcg_temp_free_ptr(tcg_ctx_00,arg1);
  }
  else {
    gen_exception(ctx,0x49);
  }
  return;
}

Assistant:

static void trans_vmrgew(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int VT = rD(ctx->opcode);
    int VA = rA(ctx->opcode);
    int VB = rB(ctx->opcode);
    TCGv_i64 tmp = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 avr = tcg_temp_new_i64(tcg_ctx);

    get_avr64(tcg_ctx, avr, VB, true);
    tcg_gen_shri_i64(tcg_ctx, tmp, avr, 32);
    get_avr64(tcg_ctx, avr, VA, true);
    tcg_gen_deposit_i64(tcg_ctx, avr, avr, tmp, 0, 32);
    set_avr64(tcg_ctx, VT, avr, true);

    get_avr64(tcg_ctx, avr, VB, false);
    tcg_gen_shri_i64(tcg_ctx, tmp, avr, 32);
    get_avr64(tcg_ctx, avr, VA, false);
    tcg_gen_deposit_i64(tcg_ctx, avr, avr, tmp, 0, 32);
    set_avr64(tcg_ctx, VT, avr, false);

    tcg_temp_free_i64(tcg_ctx, tmp);
    tcg_temp_free_i64(tcg_ctx, avr);
}